

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.hpp
# Opt level: O2

domain_manager * __thiscall
cs::domain_manager::add_buildin_type<char_const(&)[5]>
          (domain_manager *this,char (*name) [5],function<cs_impl::any_()> *func,type_index *id,
          namespace_t *ext)

{
  domain_manager *pdVar1;
  allocator local_51;
  string local_50;
  
  std::__cxx11::string::string((string *)&local_50,*name,&local_51);
  add_record(this,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  phmap::priv::
  raw_hash_set<phmap::priv::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::emplace<const_char_(&)[5],_0>
            ((pair<phmap::priv::raw_hash_set<phmap::priv::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::iterator,_bool>
              *)&local_50,
             &(this->buildin_symbols).
              super_raw_hash_set<phmap::priv::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ,name);
  cs_impl::any::
  make_protect<cs::type_t,std::function<cs_impl::any()>const&,std::type_index_const&,std::shared_ptr<cs::name_space>&>
            ((any *)&local_50,func,id,ext);
  pdVar1 = add_var<char_const(&)[5]>(this,name,(var *)&local_50);
  cs_impl::any::recycle((any *)&local_50);
  return pdVar1;
}

Assistant:

domain_manager &
		add_buildin_type(T &&name, const std::function<var()> &func, const std::type_index &id, namespace_t ext)
		{
			add_record(name);
			buildin_symbols.emplace(name);
			return add_var(name, var::make_protect<type_t>(func, id, ext));
		}